

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O0

void Diligent::
     LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[35],char_const*,char[71],char_const*,char[73]>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,char (*Args) [16],
               char **Args_1,char (*Args_2) [7],char **Args_3,char (*Args_4) [15],
               char (*Args_5) [23],char **Args_6,char (*Args_7) [35],char **Args_8,
               char (*Args_9) [71],char **Args_10,char (*Args_11) [73])

{
  undefined *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  char *pcVar5;
  char (*in_stack_fffffffffffffec0) [73];
  undefined1 local_b8 [8];
  string Msg;
  size_type LastSlashPos;
  allocator local_79;
  string local_78 [8];
  string FileName;
  char **Args_local_1;
  char (*Args_local) [16];
  int Line_local;
  char *FullFilePath_local;
  char *Function_local;
  bool IsFatal_local;
  
  FileName.field_2._8_8_ = Args_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,FullFilePath,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Msg.field_2._8_8_ = std::__cxx11::string::find_last_of((char *)local_78,0xc073fa);
  if (Msg.field_2._8_8_ != -1) {
    std::__cxx11::string::erase((ulong)local_78,0);
  }
  FormatString<char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[35],char_const*,char[71],char_const*,char[73]>
            ((string *)local_b8,(Diligent *)Args,(char (*) [16])FileName.field_2._8_8_,
             (char **)Args_2,(char (*) [7])Args_3,(char **)Args_4,(char (*) [15])Args_5,
             (char (*) [23])Args_6,(char **)Args_7,(char (*) [35])Args_8,(char **)Args_9,
             (char (*) [71])Args_10,(char **)Args_11,in_stack_fffffffffffffec0);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback == (undefined *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Diligent Engine: ");
    pcVar5 = "Error";
    if (IsFatal) {
      pcVar5 = "Fatal Error";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," in ");
    poVar4 = std::operator<<(poVar4,Function);
    poVar4 = std::operator<<(poVar4,"() (");
    poVar4 = std::operator<<(poVar4,local_78);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,Line);
    poVar4 = std::operator<<(poVar4,"): ");
    poVar4 = std::operator<<(poVar4,(string *)local_b8);
    std::operator<<(poVar4,'\n');
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(IsFatal | 2,uVar2,Function,uVar3,Line);
  }
  ThrowIf<true>((string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}